

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

Territory findMatch(int parentNumber,char *territoryISO)

{
  __int32_t *p_Var1;
  int iVar2;
  long lVar3;
  __int32_t **pp_Var4;
  undefined8 *puVar5;
  char *pcVar6;
  Territory TVar7;
  char cVar8;
  char codeISO [8];
  AlphaRec t;
  undefined2 local_30;
  undefined1 local_2e;
  char *local_28 [2];
  
  TVar7 = TERRITORY_NONE;
  if (-1 < parentNumber) {
    if (parentNumber == 0) {
      lVar3 = 0;
    }
    else {
      local_30 = *(undefined2 *)
                  ("?????BDFCGHJKLMNRSTUEPQWYZ?????????A????XV??????????????????????" +
                  (ulong)(uint)parentNumber * 3 + 0x3e);
      local_2e = 0x2d;
      lVar3 = 3;
    }
    do {
      cVar8 = *territoryISO;
      if (cVar8 < '!') goto LAB_001cfde8;
      territoryISO = territoryISO + 1;
      *(char *)((long)&local_30 + lVar3) = cVar8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
    lVar3 = 7;
    if (*territoryISO < '!') {
LAB_001cfde8:
      *(undefined1 *)((long)&local_30 + lVar3) = 0;
      cVar8 = (char)local_30;
      if ((char)local_30 != '\0') {
        pp_Var4 = __ctype_toupper_loc();
        p_Var1 = *pp_Var4;
        pcVar6 = (char *)((long)&local_30 + 1);
        do {
          pcVar6[-1] = (char)p_Var1[cVar8];
          cVar8 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar8 != '\0');
      }
      local_28[0] = (char *)&local_30;
      puVar5 = (undefined8 *)bsearch(local_28,ALPHA_SEARCH,0x394,0x10,compareAlphaCode);
      if (puVar5 != (undefined8 *)0x0) {
        iVar2 = strcmp(local_28[0],(char *)*puVar5);
        if (iVar2 == 0) {
          TVar7 = *(Territory *)(puVar5 + 1);
        }
      }
    }
  }
  return TVar7;
}

Assistant:

static enum Territory findMatch(const int parentNumber, const char *territoryISO) {
    // build an uppercase search term
    char codeISO[MAX_ISOCODE_ASCII_LEN + 1];
    const char *r = territoryISO;
    int len = 0;
    ASSERT(territoryISO);

    if (parentNumber < 0) {
        return TERRITORY_NONE;
    }
    if (parentNumber > 0) {
        codeISO[0] = PARENTS_2[3 * parentNumber - 3];
        codeISO[1] = PARENTS_2[3 * parentNumber - 2];
        codeISO[2] = '-';
        len = 3;
    }
    while ((len < MAX_ISOCODE_ASCII_LEN) && (*r > 32)) {
        codeISO[len++] = *r++;
    }
    if (*r > 32) {
        return TERRITORY_NONE;
    }
    codeISO[len] = 0;
    makeUppercase(codeISO);
    { // binary-search the result
        const AlphaRec *p;
        AlphaRec t;
        t.alphaCode = codeISO;

        p = (const AlphaRec *) bsearch(&t, ALPHA_SEARCH, NR_TERRITORY_RECS, sizeof(AlphaRec), compareAlphaCode);
        if (p) {
            if (strcmp(t.alphaCode, p->alphaCode) == 0) { // only interested in PERFECT match
                return p->territory;
            } // match
        } // found
    } //
    return TERRITORY_NONE;
}